

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [3],
          long *params_2,char (*params_3) [6])

{
  String *value;
  char (*value_00) [3];
  long *value_01;
  char (*value_02) [6];
  ArrayPtr<const_char> local_88;
  CappedArray<char,_26UL> local_78;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  char (*local_30) [6];
  char (*params_local_3) [6];
  long *params_local_2;
  char (*params_local_1) [3];
  String *params_local;
  
  local_30 = (char (*) [6])params_2;
  params_local_3 = (char (*) [6])params_1;
  params_local_2 = (long *)params;
  params_local_1 = (char (*) [3])this;
  params_local = __return_storage_ptr__;
  value = fwd<kj::String&>((String *)this);
  local_40 = toCharSequence<kj::String&>(value);
  value_00 = ::const((char (*) [3])params_local_2);
  local_50 = toCharSequence<char_const(&)[3]>(value_00);
  value_01 = fwd<long>((NoInfer<long> *)params_local_3);
  toCharSequence<long>(&local_78,value_01);
  value_02 = ::const(local_30);
  local_88 = toCharSequence<char_const(&)[6]>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,(ArrayPtr<const_char> *)&local_78,
             (CappedArray<char,_26UL> *)&local_88,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}